

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::ParseSingleValue(Parser *this,Value *e)

{
  bool bVar1;
  reference ppEVar2;
  int t;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  EnumVal *local_30;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_20;
  iterator it;
  Value *e_local;
  Parser *this_local;
  
  it._M_current = (EnumDef **)e;
  bVar1 = IsScalar((e->type).base_type);
  bVar1 = TryTypedValue(this,2,bVar1,(Value *)it._M_current,BASE_TYPE_INT);
  if (!bVar1) {
    bVar1 = IsFloat(*(BaseType *)it._M_current);
    bVar1 = TryTypedValue(this,3,bVar1,(Value *)it._M_current,BASE_TYPE_FLOAT);
    if ((!bVar1) &&
       (bVar1 = TryTypedValue(this,1,*(int *)it._M_current == 0xd,(Value *)it._M_current,
                              BASE_TYPE_STRING), !bVar1)) {
      if (this->token_ == 4) {
        local_20._M_current =
             (EnumDef **)
             std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                       (&(this->enums_).vec);
        while( true ) {
          ev = (EnumVal *)
               std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                         (&(this->enums_).vec);
          bVar1 = __gnu_cxx::operator!=
                            (&local_20,
                             (__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                              *)&ev);
          if (!bVar1) break;
          ppEVar2 = __gnu_cxx::
                    __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                    ::operator*(&local_20);
          local_30 = SymbolTable<flatbuffers::EnumVal>::Lookup(&(*ppEVar2)->vals,&this->attribute_);
          if (local_30 != (EnumVal *)0x0) {
            NumToString<int>(&local_50,local_30->value);
            std::__cxx11::string::operator=((string *)&this->attribute_,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            bVar1 = IsInteger(*(BaseType *)it._M_current);
            TryTypedValue(this,4,bVar1,(Value *)it._M_current,BASE_TYPE_INT);
            return;
          }
          __gnu_cxx::
          __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
          ::operator++(&local_20);
        }
        std::operator+(&local_70,"not valid enum value: ",&this->attribute_);
        Error(&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        TokenToString_abi_cxx11_(&local_c0,(flatbuffers *)(ulong)(uint)this->token_,t);
        std::operator+(&local_a0,"cannot parse value starting with: ",&local_c0);
        Error(&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  }
  return;
}

Assistant:

void Parser::ParseSingleValue(Value &e) {
  if (TryTypedValue(kTokenIntegerConstant,
                    IsScalar(e.type.base_type),
                    e,
                    BASE_TYPE_INT) ||
      TryTypedValue(kTokenFloatConstant,
                    IsFloat(e.type.base_type),
                    e,
                    BASE_TYPE_FLOAT) ||
      TryTypedValue(kTokenStringConstant,
                    e.type.base_type == BASE_TYPE_STRING,
                    e,
                    BASE_TYPE_STRING)) {
  } else if (token_ == kTokenIdentifier) {
    for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
      auto ev = (*it)->vals.Lookup(attribute_);
      if (ev) {
        attribute_ = NumToString(ev->value);
        TryTypedValue(kTokenIdentifier,
                      IsInteger(e.type.base_type),
                      e,
                      BASE_TYPE_INT);
        return;
      }
    }
    Error("not valid enum value: " + attribute_);
  } else {
    Error("cannot parse value starting with: " + TokenToString(token_));
  }
}